

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

unsigned_long Aig_Hash(Aig_Obj_t *pObj,int TableSize)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar3 = 0x6a3;
  if ((*(uint *)&pObj->field_0x18 & 7) != 6) {
    uVar3 = uVar2;
  }
  uVar4 = 0x38f;
  if (((ulong)pObj->pFanin0 & 1) == 0) {
    uVar4 = uVar2;
  }
  uVar1 = 0x161;
  if (((ulong)pObj->pFanin1 & 1) == 0) {
    uVar1 = uVar2;
  }
  return (uVar1 ^ (long)*(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24) * 0xb9b ^
         uVar4 ^ uVar3 ^ (long)*(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24) * 0x1f01
         ) % (ulong)(long)TableSize;
}

Assistant:

static inline int          Aig_ObjIsExor( Aig_Obj_t * pObj )      { return pObj->Type == AIG_OBJ_EXOR;   }